

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool bssl::ReadUTCOrGeneralizedTime(Parser *parser,GeneralizedTime *out)

{
  bool bVar1;
  GeneralizedTime *in_RCX;
  Input in;
  Input in_00;
  CBS_ASN1_TAG local_34;
  undefined1 auStack_30 [4];
  CBS_ASN1_TAG tag;
  Input value;
  GeneralizedTime *out_local;
  Parser *parser_local;
  
  value.data_.size_ = (size_t)out;
  der::Input::Input((Input *)auStack_30);
  bVar1 = der::Parser::ReadTagAndValue(parser,&local_34,(Input *)auStack_30);
  if (bVar1) {
    if (local_34 == 0x17) {
      in.data_.size_ = value.data_.size_;
      in.data_.data_ = value.data_.data_;
      parser_local._7_1_ = der::ParseUTCTime(_auStack_30,in,in_RCX);
    }
    else if (local_34 == 0x18) {
      in_00.data_.size_ = value.data_.size_;
      in_00.data_.data_ = value.data_.data_;
      parser_local._7_1_ = der::ParseGeneralizedTime(_auStack_30,in_00,in_RCX);
    }
    else {
      parser_local._7_1_ = false;
    }
  }
  else {
    parser_local._7_1_ = false;
  }
  return parser_local._7_1_;
}

Assistant:

bool ReadUTCOrGeneralizedTime(der::Parser *parser, der::GeneralizedTime *out) {
  der::Input value;
  CBS_ASN1_TAG tag;

  if (!parser->ReadTagAndValue(&tag, &value)) {
    return false;
  }

  if (tag == CBS_ASN1_UTCTIME) {
    return der::ParseUTCTime(value, out);
  }

  if (tag == CBS_ASN1_GENERALIZEDTIME) {
    return der::ParseGeneralizedTime(value, out);
  }

  // Unrecognized tag.
  return false;
}